

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_sendrecv(Curl_easy *data,curltime *nowp)

{
  undefined1 *puVar1;
  byte bVar2;
  connectdata *pcVar3;
  long lVar4;
  long lVar5;
  curl_off_t cVar6;
  curl_trc_feat *pcVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  bool bVar14;
  _Bool _Var15;
  uint uVar16;
  CURLcode CVar17;
  int iVar18;
  uint uVar19;
  undefined7 extraout_var;
  timediff_t tVar20;
  size_t sVar21;
  ulong uVar22;
  long lVar23;
  size_t sVar24;
  bool bVar25;
  curltime newer;
  curltime older;
  curltime now;
  _Bool local_69;
  curltime *local_68;
  ulong local_60;
  ssize_t nread;
  connectdata *local_50;
  char *local_48;
  char *xfer_buf;
  size_t local_38;
  
  bVar2 = (data->state).select_bits;
  if (bVar2 == 0) {
    uVar16 = (data->req).keepon;
  }
  else {
    uVar16 = (data->req).keepon;
    if (((bVar2 & (uVar16 & 0x10) == 0) == 0) &&
       ((byte)((uVar16 & 0x30) == 0 | (uVar16 & 0x20) == 0 & bVar2 >> 1) != 1)) {
      return CURLE_OK;
    }
    (data->state).select_bits = '\0';
  }
  bVar14 = false;
  if ((uVar16 & 1) != 0) {
    pcVar3 = data->conn;
    CVar17 = Curl_multi_xfer_buf_borrow(data,&xfer_buf,&local_38);
    if (CVar17 == CURLE_OK) {
      iVar18 = 10;
      bVar14 = false;
      lVar23 = 0;
      uVar22 = 0;
      local_68 = nowp;
      local_50 = pcVar3;
      do {
        if ((uVar22 & 1) == 0) {
          _Var15 = Curl_conn_is_multiplex(local_50,0);
          uVar22 = CONCAT71(extraout_var,_Var15) & 0xffffffff;
        }
        local_48 = xfer_buf;
        local_60 = uVar22;
        if (local_38 != 0) {
          sVar21 = (data->set).max_recv_speed;
          sVar24 = local_38;
          if ((long)sVar21 < 1) goto LAB_0015a02c;
          if (lVar23 == 0) {
            if ((long)sVar21 < (long)local_38) {
              sVar24 = sVar21;
            }
            goto LAB_0015a02c;
          }
LAB_0015a282:
          uVar22 = local_60;
          nowp = local_68;
          if (iVar18 < 1) goto LAB_0015a35d;
          uVar16 = data->conn->handler->protocol;
          if ((uVar16 & 0xc) == 0) {
            if ((uVar16 & 0x30) != 0) goto LAB_0015a35d;
            iVar18 = 0;
          }
          else {
            iVar18 = 1;
          }
          _Var15 = Curl_conn_data_pending(data,iVar18);
          if (_Var15) goto LAB_0015a35d;
          uVar16 = (data->req).keepon;
          goto LAB_0015a37b;
        }
        sVar24 = 0;
LAB_0015a02c:
        if ((((uVar22 & 1) != 0) || (((data->req).field_0xd1 & 1) != 0)) ||
           (lVar4 = (data->req).size, lVar4 == -1)) {
          pcVar3 = data->conn;
          if ((pcVar3 == (connectdata *)0x0) || (pcVar3->sockfd == -1)) {
LAB_0015a0fb:
            sVar21 = sVar24;
            if (sVar24 != 0) goto LAB_0015a103;
          }
          else {
            _Var15 = Curl_shutdown_started(data,(uint)(pcVar3->sockfd == pcVar3->sock[1]));
            if ((sVar24 != 0) && (sVar21 = sVar24, !_Var15)) goto LAB_0015a103;
          }
LAB_0015a09b:
          nread = 0;
LAB_0015a0a1:
          if (((data->req).field_0xd3 & 0x10) != 0) {
            pcVar3 = data->conn;
            CVar17 = CURLE_FAILED_INIT;
            if (((pcVar3 != (connectdata *)0x0) && (pcVar3->sockfd != -1)) &&
               ((CVar17 = Curl_conn_shutdown(data,(uint)(pcVar3->sockfd == pcVar3->sock[1]),
                                             &local_69), CVar17 == CURLE_OK &&
                (CVar17 = CURLE_AGAIN, local_69 == true)))) goto LAB_0015a1ec;
LAB_0015a120:
            nowp = local_68;
            if (CVar17 != CURLE_AGAIN) goto LAB_0015a3cd;
            if ((*(uint *)&(data->req).field_0xd1 & 0x22008) != 0x20008) goto LAB_0015a282;
          }
LAB_0015a142:
          CVar17 = Curl_req_stop_send_recv(data);
          if (CVar17 != CURLE_OK) goto LAB_0015a2dd;
          if (((data->req).field_0xd1 & 0x10) == 0) {
            _Var15 = true;
            sVar21 = 0;
            goto LAB_0015a165;
          }
LAB_0015a27c:
          bVar14 = true;
          goto LAB_0015a282;
        }
        lVar5 = (data->req).bytecount;
        sVar21 = lVar4 - lVar5;
        if (sVar21 == 0 || lVar4 < lVar5) goto LAB_0015a09b;
        if ((long)sVar24 <= (long)sVar21) goto LAB_0015a0fb;
LAB_0015a103:
        CVar17 = Curl_xfer_recv(data,local_48,sVar21,&nread);
        if (CVar17 != CURLE_OK) goto LAB_0015a120;
        if (nread == 0) goto LAB_0015a0a1;
LAB_0015a1ec:
        if (nread < 0) {
          CVar17 = CURLE_OK;
          nowp = local_68;
          goto LAB_0015a3cd;
        }
        if (nread == 0) goto LAB_0015a142;
        _Var15 = false;
        sVar21 = nread;
LAB_0015a165:
        CVar17 = Curl_xfer_write_resp(data,local_48,sVar21,_Var15);
        if (CVar17 != CURLE_OK) {
LAB_0015a2dd:
          bVar14 = true;
          nowp = local_68;
          goto LAB_0015a3cd;
        }
        uVar16 = *(uint *)&(data->req).field_0xd1;
        if ((uVar16 & 2) != 0) {
          CVar17 = CURLE_OK;
          goto LAB_0015a2dd;
        }
        uVar19 = (data->req).keepon;
        if ((byte)(_Var15 | (byte)((uVar16 & 8) >> 3) & ((byte)local_60 ^ 1)) == 1) {
          uVar19 = uVar19 & 0xfffffffe;
          (data->req).keepon = uVar19;
        }
        if ((uVar19 & 0x11) != 1) goto LAB_0015a27c;
        lVar23 = lVar23 + sVar21;
        bVar14 = true;
        bVar25 = iVar18 != 0;
        iVar18 = iVar18 + -1;
        uVar22 = local_60;
      } while (bVar25);
      bVar14 = true;
      nowp = local_68;
LAB_0015a35d:
      uVar16 = (data->req).keepon;
      (data->state).select_bits = ((uVar16 & 0x2a) == 2) * '\x02' + '\x01';
LAB_0015a37b:
      CVar17 = CURLE_OK;
      if (((uVar16 & 3) == 2) && ((((ulong)local_50->bits & 0x20) != 0 || ((uVar22 & 1) != 0)))) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"we are done reading and this is set to close, stop send");
        }
        Curl_req_abort_sending(data);
        CVar17 = CURLE_OK;
      }
    }
    else {
      bVar14 = false;
    }
LAB_0015a3cd:
    Curl_multi_xfer_buf_release(data,xfer_buf);
    if (CVar17 != CURLE_OK) {
      return CVar17;
    }
    if (((data->req).field_0xd1 & 2) != 0) {
      return CURLE_OK;
    }
  }
  _Var15 = Curl_req_want_send(data);
  if (((!_Var15) && (((data->req).keepon & 0x40) == 0)) ||
     (_Var15 = Curl_req_done_sending(data), _Var15)) {
    if (bVar14) goto LAB_00159f94;
    CVar17 = Curl_conn_ev_data_idle(data);
  }
  else {
    CVar17 = Curl_req_send_more(data);
  }
  if (CVar17 != CURLE_OK) {
    return CVar17;
  }
LAB_00159f94:
  iVar18 = Curl_pgrsUpdate(data);
  if (iVar18 != 0) {
    return CURLE_ABORTED_BY_CALLBACK;
  }
  uVar8 = nowp->tv_sec;
  uVar9 = nowp->tv_usec;
  now.tv_usec = uVar9;
  now.tv_sec = uVar8;
  now._12_4_ = 0;
  CVar17 = Curl_speedcheck(data,now);
  if (CVar17 != CURLE_OK) {
    return CVar17;
  }
  if ((data->req).keepon == 0) {
    if (((((data->req).field_0xd3 & 2) == 0) && (lVar23 = (data->req).size, lVar23 != -1)) &&
       ((lVar23 != (data->req).bytecount && ((data->req).newurl == (char *)0x0)))) {
      Curl_failf(data,"transfer closed with %ld bytes remaining to read");
      return CURLE_PARTIAL_FILE;
    }
    iVar18 = Curl_pgrsUpdate(data);
    if (iVar18 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  else {
    tVar20 = Curl_timeleft(data,nowp,false);
    if (tVar20 < 0) {
      lVar23 = (data->req).size;
      uVar10 = nowp->tv_sec;
      uVar11 = nowp->tv_usec;
      newer.tv_usec = uVar11;
      newer.tv_sec = uVar10;
      uVar12 = (data->progress).t_startsingle.tv_sec;
      uVar13 = (data->progress).t_startsingle.tv_usec;
      older.tv_usec = uVar13;
      older.tv_sec = uVar12;
      newer._12_4_ = 0;
      older._12_4_ = 0;
      tVar20 = Curl_timediff(newer,older);
      cVar6 = (data->req).bytecount;
      if (lVar23 == -1) {
        Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar20,
                   cVar6);
      }
      else {
        Curl_failf(data,
                   "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                   tVar20,cVar6,(data->req).size);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  if (((data->req).keepon & 0x3f) == 0) {
    puVar1 = &(data->req).field_0xd1;
    *puVar1 = *puVar1 | 2;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_sendrecv(struct Curl_easy *data, struct curltime *nowp)
{
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;
  int didwhat = 0;

  DEBUGASSERT(nowp);
  if(data->state.select_bits) {
    if(select_bits_paused(data, data->state.select_bits)) {
      /* leave the bits unchanged, so they'll tell us what to do when
       * this transfer gets unpaused. */
      result = CURLE_OK;
      goto out;
    }
    data->state.select_bits = 0;
  }

  /* We go ahead and do a read if we have a readable socket or if the stream
     was rewound (in which case we have data in a buffer) */
  if(k->keepon & KEEP_RECV) {
    result = sendrecv_dl(data, k, &didwhat);
    if(result || data->req.done)
      goto out;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if(Curl_req_want_send(data) || (data->req.keepon & KEEP_SEND_TIMED)) {
    result = sendrecv_ul(data, &didwhat);
    if(result)
      goto out;
  }

  if(!didwhat) {
    /* Transfer wanted to send/recv, but nothing was possible. */
    result = Curl_conn_ev_data_idle(data);
    if(result)
      goto out;
  }

  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, *nowp);
  if(result)
    goto out;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, nowp, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " out of %"
              FMT_OFF_T " bytes received",
              Curl_timediff(*nowp, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " bytes received",
              Curl_timediff(*nowp, data->progress.t_startsingle),
              k->bytecount);
      }
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */
    if(!(data->req.no_body) && (k->size != -1) &&
       (k->bytecount != k->size) && !k->newurl) {
      failf(data, "transfer closed with %" FMT_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      result = CURLE_PARTIAL_FILE;
      goto out;
    }
    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

  /* If there is nothing more to send/recv, the request is done */
  if(0 == (k->keepon&(KEEP_RECVBITS|KEEP_SENDBITS)))
    data->req.done = TRUE;

out:
  if(result)
    DEBUGF(infof(data, "Curl_sendrecv() -> %d", result));
  return result;
}